

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O1

size_t despace64(char *bytes,size_t howmany)

{
  byte bVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  int k;
  long lVar6;
  ulong uVar7;
  
  if (howmany < 8) {
    uVar7 = 0;
    sVar2 = 0;
  }
  else {
    sVar2 = 0;
    pcVar3 = bytes;
    uVar4 = 0;
    do {
      uVar7 = *(ulong *)(bytes + uVar4);
      if ((((~(0x101010101010100 - (uVar7 ^ 0xd0d0d0d0d0d0d0d) | uVar7) & 0x8080808080808080) == 0)
          && ((~(0x101010101010100 - (uVar7 ^ 0xa0a0a0a0a0a0a0a) | uVar7) & 0x8080808080808080) == 0
             )) && ((~(0x101010101010100 - (uVar7 ^ 0x2020202020202020) | uVar7) &
                    0x8080808080808080) == 0)) {
        *(ulong *)(bytes + sVar2) = uVar7;
        sVar2 = sVar2 + 8;
      }
      else {
        lVar6 = 0;
        do {
          bVar1 = pcVar3[lVar6];
          if ((0x20 < (ulong)bVar1) || ((0x100002400U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
            bytes[sVar2] = bVar1;
            sVar2 = sVar2 + 1;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 8);
      }
      uVar7 = uVar4 + 8;
      uVar5 = uVar4 + 0xf;
      pcVar3 = pcVar3 + 8;
      uVar4 = uVar7;
    } while (uVar5 < howmany);
  }
  if (uVar7 < howmany) {
    do {
      bVar1 = bytes[uVar7];
      if ((0x20 < (ulong)bVar1) || ((0x100002400U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        bytes[sVar2] = bVar1;
        sVar2 = sVar2 + 1;
      }
      uVar7 = uVar7 + 1;
    } while (howmany != uVar7);
  }
  return sVar2;
}

Assistant:

size_t despace64(char *bytes, size_t howmany) {
  size_t pos = 0;
  size_t i = 0;
  uint64_t word = 0;
  uint64_t mask1 = ~UINT64_C(0) / 255 * (uint64_t)('\r');
  uint64_t mask2 = ~UINT64_C(0) / 255 * (uint64_t)('\n');
  uint64_t mask3 = ~UINT64_C(0) / 255 * (uint64_t)(' ');

  for (; i + 7 < howmany; i += 8) {
    memcpy(&word, bytes + i, sizeof(word));
    uint64_t xor1 = word ^ mask1;
    uint64_t xor2 = word ^ mask2;
    uint64_t xor3 = word ^ mask3;

    if (haszero(xor1) || haszero(xor2) || haszero(xor3)) {
      for (int k = 0; k < 8; k++) {
        char c = bytes[i + k];
        if (c == '\r' || c == '\n' || c == ' ') {
          continue;
        }
        bytes[pos++] = c;
      }

    } else {
      memmove(bytes + pos, bytes + i, sizeof(word));
      pos += 8;
    }
  }

  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}